

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

Token * error_token(Token *__return_storage_ptr__,Scanner *scanner,char *message)

{
  size_t sVar1;
  
  __return_storage_ptr__->type = TOKEN_ERROR;
  __return_storage_ptr__->start = message;
  sVar1 = strlen(message);
  __return_storage_ptr__->length = (long)(int)sVar1;
  __return_storage_ptr__->line = scanner->line;
  return __return_storage_ptr__;
}

Assistant:

static Token error_token(Scanner *scanner, const char *message) {
    Token token;
    token.type = TOKEN_ERROR;
    token.start = message;
    token.length = (int) strlen(message);
    token.line = scanner->line;

    return token;
}